

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

void __thiscall
dxil_spv::SPIRVModule::Impl::add_instrumented_instruction(Impl *this,Op op,Block *bb,Id id)

{
  Builder *pBVar1;
  Vector<Id> *this_00;
  InstructionInstrumentationState *instrumentation;
  pointer ppIVar2;
  iterator iVar3;
  Id IVar4;
  Id IVar5;
  uint uVar6;
  int iVar7;
  Instruction *instruction;
  Id *pIVar8;
  ulong uVar9;
  Instruction *raw_instruction;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  Vector<Id> local_58;
  ulong local_38;
  
  if ((id != 0) && ((this->instruction_instrumentation).info.enabled == true)) {
    if (op == OpAssumeTrueKHR) {
      pIVar8 = &(this->instruction_instrumentation).assume_true_call_id;
      uVar9 = 0;
    }
    else {
      ppIVar2 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ppIVar2[id]->typeId;
      uVar9 = (ulong)uVar6;
      if (ppIVar2[uVar9]->opCode != OpTypeFloat) {
        return;
      }
      iVar7 = spv::Builder::getScalarTypeWidth(&this->builder,uVar6);
      if (iVar7 == 0x40) {
        pIVar8 = &(this->instruction_instrumentation).nan_inf_instrument_fp64_call_id;
      }
      else if (iVar7 == 0x20) {
        pIVar8 = &(this->instruction_instrumentation).nan_inf_instrument_fp32_call_id;
      }
      else if (iVar7 == 0x10) {
        pIVar8 = &(this->instruction_instrumentation).nan_inf_instrument_fp16_call_id;
      }
      else {
        pIVar8 = (Id *)0x0;
      }
    }
    if ((this->instruction_instrumentation).should_report_instrumentation_id == 0) {
      pBVar1 = &this->builder;
      local_38 = uVar9;
      IVar4 = spv::Builder::makeBoolType(pBVar1);
      IVar5 = spv::Builder::makeBoolConstant(pBVar1,true,false);
      IVar4 = spv::Builder::createVariableWithInitializer
                        (pBVar1,StorageClassPrivate,IVar4,IVar5,"ShouldReportInstrumentation");
      register_active_variable(this,StorageClassPrivate,IVar4);
      (this->instruction_instrumentation).should_report_instrumentation_id = IVar4;
      IVar4 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
      IVar5 = spv::Builder::makeVectorType(pBVar1,IVar4,4);
      IVar4 = spv::Builder::makeRuntimeArray(pBVar1,IVar4);
      spv::Builder::addDecoration(pBVar1,IVar4,DecorationArrayStride,4);
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      *local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar4;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      IVar4 = spv::Builder::makeStructType(pBVar1,&local_58,"InstrumentationControlDataSSBO");
      if (local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_58.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      spv::Builder::addMemberDecoration(pBVar1,IVar4,0,DecorationOffset,0);
      spv::Builder::addMemberName(pBVar1,IVar4,0,"atomics");
      spv::Builder::addDecoration(pBVar1,IVar4,DecorationBlock,-1);
      IVar4 = spv::Builder::createVariable
                        (pBVar1,StorageClassStorageBuffer,IVar4,"InstrumentationControlData");
      register_active_variable(this,StorageClassStorageBuffer,IVar4);
      (this->instruction_instrumentation).global_nan_inf_control_var_id = IVar4;
      spv::Builder::addDecoration
                (pBVar1,IVar4,DecorationDescriptorSet,
                 (this->instruction_instrumentation).info.control_desc_set);
      spv::Builder::addDecoration
                (pBVar1,(this->instruction_instrumentation).global_nan_inf_control_var_id,
                 DecorationBinding,(this->instruction_instrumentation).info.control_binding);
      IVar4 = spv::Builder::makeRuntimeArray(pBVar1,IVar5);
      spv::Builder::addDecoration(pBVar1,IVar4,DecorationArrayStride,0x10);
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      *local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar4;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      IVar4 = spv::Builder::makeStructType(pBVar1,&local_58,"InstrumentationDataSSBO");
      if (local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_58.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      spv::Builder::addMemberName(pBVar1,IVar4,0,"data");
      spv::Builder::addMemberDecoration(pBVar1,IVar4,0,DecorationOffset,0);
      spv::Builder::addDecoration(pBVar1,IVar4,DecorationBlock,-1);
      IVar4 = spv::Builder::createVariable
                        (pBVar1,StorageClassStorageBuffer,IVar4,"InstrumentationData");
      register_active_variable(this,StorageClassStorageBuffer,IVar4);
      (this->instruction_instrumentation).global_nan_inf_data_var_id = IVar4;
      spv::Builder::addDecoration
                (pBVar1,IVar4,DecorationDescriptorSet,
                 (this->instruction_instrumentation).info.payload_desc_set);
      spv::Builder::addDecoration
                (pBVar1,(this->instruction_instrumentation).global_nan_inf_data_var_id,
                 DecorationBinding,(this->instruction_instrumentation).info.payload_binding);
      uVar9 = local_38;
    }
    instrumentation = &this->instruction_instrumentation;
    if ((pIVar8 != (Id *)0x0) && (*pIVar8 == 0)) {
      if (op == OpAssumeTrueKHR) {
        uVar6 = build_assume_true_call_function(this->self,instrumentation);
      }
      else {
        uVar6 = build_nan_inf_instrument_call_function(this->self,instrumentation,(Id)uVar9);
      }
      *pIVar8 = uVar6;
    }
    pBVar1 = &this->builder;
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    IVar4 = spv::Builder::makeVoidType(pBVar1);
    instruction = (Instruction *)allocate_in_thread(0x38);
    instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    instruction->resultId = IVar5;
    instruction->typeId = IVar4;
    instruction->opCode = OpFunctionCall;
    this_00 = &instruction->operands;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    instruction->block = (Block *)0x0;
    iVar3._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = *pIVar8;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar3,
                 (uint *)&local_58);
    }
    else {
      *iVar3._M_current = *pIVar8;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    iVar3._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = id;
    if (iVar3._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar3,
                 (uint *)&local_58);
    }
    else {
      *iVar3._M_current = id;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    uVar6 = instrumentation->instruction_count + 1;
    instrumentation->instruction_count = uVar6;
    IVar4 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(pBVar1,IVar4,uVar6,false);
    local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar4);
    iVar3._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar3,
                 (uint *)&local_58);
    }
    else {
      *iVar3._M_current = IVar4;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_60._M_head_impl = instruction;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&bb->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_60);
    instruction->block = bb;
    if (instruction->resultId != 0) {
      spv::Module::mapInstruction(bb->parent->parent,instruction);
    }
    if (local_60._M_head_impl != (Instruction *)0x0) {
      (*(local_60._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  return;
}

Assistant:

void SPIRVModule::Impl::add_instrumented_instruction(spv::Op op, spv::Block *bb, spv::Id id)
{
	if (id == 0 || !instruction_instrumentation.info.enabled)
		return;

	spv::Id *call_id = nullptr;
	spv::Id type_id = 0;

	if (op == spv::OpAssumeTrueKHR)
	{
		call_id = &instruction_instrumentation.assume_true_call_id;
	}
	else
	{
		type_id = builder.getTypeId(id);
		if (builder.getTypeClass(type_id) != spv::OpTypeFloat)
			return;

		switch (builder.getScalarTypeWidth(type_id))
		{
		case 16:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp16_call_id;
			break;

		case 32:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp32_call_id;
			break;

		case 64:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp64_call_id;
			break;

		default:
			break;
		}
	}

	if (!instruction_instrumentation.should_report_instrumentation_id)
	{
		instruction_instrumentation.should_report_instrumentation_id = create_variable_with_initializer(
			spv::StorageClassPrivate, builder.makeBoolType(),
			builder.makeBoolConstant(true), "ShouldReportInstrumentation");

		spv::Id u32_type = builder.makeUintType(32);
		spv::Id uvec4_type = builder.makeVectorType(u32_type, 4);
		spv::Id u32_array_type = builder.makeRuntimeArray(u32_type);
		builder.addDecoration(u32_array_type, spv::DecorationArrayStride, 4);
		spv::Id control_data = builder.makeStructType({ u32_array_type }, "InstrumentationControlDataSSBO");
		builder.addMemberDecoration(control_data, 0, spv::DecorationOffset, 0);
		builder.addMemberName(control_data, 0, "atomics");
		builder.addDecoration(control_data, spv::DecorationBlock);
		instruction_instrumentation.global_nan_inf_control_var_id =
			create_variable(spv::StorageClassStorageBuffer, control_data, "InstrumentationControlData");

		builder.addDecoration(instruction_instrumentation.global_nan_inf_control_var_id,
		                      spv::DecorationDescriptorSet, instruction_instrumentation.info.control_desc_set);

		builder.addDecoration(instruction_instrumentation.global_nan_inf_control_var_id,
		                      spv::DecorationBinding,
		                      instruction_instrumentation.info.control_binding);

		spv::Id payload_data_array = builder.makeRuntimeArray(uvec4_type);
		builder.addDecoration(payload_data_array, spv::DecorationArrayStride, 16);

		spv::Id payload_block = builder.makeStructType({ payload_data_array }, "InstrumentationDataSSBO");
		builder.addMemberName(payload_block, 0, "data");
		builder.addMemberDecoration(payload_block, 0, spv::DecorationOffset, 0);
		builder.addDecoration(payload_block, spv::DecorationBlock);
		instruction_instrumentation.global_nan_inf_data_var_id =
			create_variable(spv::StorageClassStorageBuffer, payload_block, "InstrumentationData");

		builder.addDecoration(instruction_instrumentation.global_nan_inf_data_var_id,
		                      spv::DecorationDescriptorSet, instruction_instrumentation.info.payload_desc_set);

		builder.addDecoration(instruction_instrumentation.global_nan_inf_data_var_id,
		                      spv::DecorationBinding,
		                      instruction_instrumentation.info.payload_binding);
	}

	if (call_id && !*call_id)
	{
		if (op == spv::OpAssumeTrueKHR)
			*call_id = build_assume_true_call_function(self, instruction_instrumentation);
		else
			*call_id = build_nan_inf_instrument_call_function(self, instruction_instrumentation, type_id);
	}

	auto call = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeVoidType(), spv::OpFunctionCall);
	call->addIdOperand(*call_id);
	call->addIdOperand(id);
	call->addIdOperand(builder.makeUintConstant(++instruction_instrumentation.instruction_count));
	bb->addInstruction(std::move(call));
}